

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O2

REF_STATUS ref_layer_puff(REF_LAYER ref_layer,REF_GRID ref_grid)

{
  int iVar1;
  REF_GRID pRVar2;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  REF_ADJ pRVar5;
  REF_ADJ_ITEM pRVar6;
  REF_LAYER pRVar7;
  uint uVar8;
  uint uVar9;
  REF_LIST pRVar10;
  long lVar11;
  undefined8 uVar12;
  REF_CELL pRVar13;
  long lVar14;
  char *pcVar15;
  REF_INT RVar16;
  REF_INT item;
  long lVar17;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  REF_DBL RVar22;
  double dVar23;
  undefined8 uStackY_210;
  int local_200;
  REF_INT node;
  REF_CELL local_1f8;
  REF_DBL angle;
  REF_INT local_1e8;
  REF_INT new_cell;
  REF_LAYER local_1e0;
  REF_CELL local_1d8;
  REF_BOOL contains1;
  REF_BOOL contains0;
  ulong local_1c8;
  double local_1c0;
  REF_CELL local_1b8;
  REF_INT ncell;
  REF_DBL norm [3];
  REF_INT nodes [27];
  REF_INT edge_nodes [27];
  REF_INT prism [27];
  
  local_1f8 = ref_grid->cell[3];
  pRVar2 = ref_layer->ref_grid;
  ref_node = pRVar2->node;
  ref_cell = pRVar2->cell[0];
  local_1b8 = pRVar2->cell[10];
  lVar14 = 0;
  local_1e0 = ref_layer;
  while( true ) {
    if (local_1e0->ref_list->n <= lVar14) break;
    uVar8 = ref_cell_nodes(local_1f8,local_1e0->ref_list->value[lVar14],nodes);
    if (uVar8 != 0) {
      pcVar15 = "nodes";
      uVar12 = 0x85;
      goto LAB_001e3b34;
    }
    for (lVar17 = 0; lVar17 < local_1f8->node_per; lVar17 = lVar17 + 1) {
      uVar8 = ref_node_add(ref_node,(long)nodes[lVar17],&node);
      if (uVar8 != 0) {
        pcVar15 = "add";
        uVar12 = 0x87;
        goto LAB_001e3b34;
      }
      iVar1 = nodes[lVar17];
      pRVar3 = ref_grid->node->real;
      pRVar4 = ref_node->real;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        pRVar4[node * 0xf + lVar11] = pRVar3[iVar1 * 0xf + lVar11];
      }
    }
    lVar14 = lVar14 + 1;
  }
  RVar16 = ref_node->n;
  local_1e0->nnode_per_layer = RVar16;
  uVar8 = 4;
  local_1e8 = RVar16;
  for (local_200 = 0; local_200 < RVar16; local_200 = local_200 + 1) {
    uVar9 = ref_node_add(ref_node,(long)local_200 + ref_grid->node->old_n_global,&node);
    if (uVar9 != 0) {
      pcVar15 = "add";
      uVar12 = 0x93;
      goto LAB_001e4028;
    }
    local_1c8 = 0xffffffff;
    if ((-1 < (long)local_200) && (local_1c8 = 0xffffffff, local_200 < ref_node->max)) {
      local_1c8 = ref_node->global[local_200];
      if (ref_node->global[local_200] < 0) {
        local_1c8 = 0xffffffffffffffff;
      }
    }
    local_1d8 = ref_grid->cell[3];
    norm[2] = 0.0;
    norm[0] = 0.0;
    norm[1] = 0.0;
    uVar18 = 0xffffffff;
    item = -1;
    if (-1 < (int)local_1c8) {
      pRVar5 = local_1d8->ref_adj;
      uVar18 = 0xffffffff;
      item = -1;
      if ((int)local_1c8 < pRVar5->nnode) {
        uVar9 = pRVar5->first[local_1c8 & 0xffffffff];
        uVar18 = 0xffffffff;
        item = -1;
        if ((long)(int)uVar9 != -1) {
          item = pRVar5->item[(int)uVar9].ref;
          uVar18 = (ulong)uVar9;
        }
      }
    }
    dVar23 = 0.0;
    while (RVar16 = local_1e8, (int)uVar18 != -1) {
      local_1c0 = dVar23;
      uVar9 = ref_list_contains(local_1e0->ref_list,item,&new_cell);
      if (uVar9 != 0) {
        pcVar15 = "in layer";
        uStackY_210 = 0x5e;
        goto LAB_001e3efb;
      }
      dVar23 = local_1c0;
      if (new_cell != 0) {
        uVar9 = ref_cell_nodes(local_1d8,item,prism);
        if (uVar9 != 0) {
          pcVar15 = "tri nodes";
          uStackY_210 = 0x60;
          goto LAB_001e3efb;
        }
        uVar9 = ref_node_tri_node_angle(ref_grid->node,prism,(REF_INT)local_1c8,&angle);
        if (uVar9 != 0) {
          pcVar15 = "angle";
          uStackY_210 = 0x62;
          goto LAB_001e3efb;
        }
        uVar9 = ref_node_tri_normal(ref_grid->node,prism,(REF_DBL *)edge_nodes);
        if (uVar9 != 0) {
          pcVar15 = "norm";
          uStackY_210 = 100;
          goto LAB_001e3efb;
        }
        uVar9 = ref_math_normalize((REF_DBL *)edge_nodes);
        if (uVar9 != 0) {
          pcVar15 = "normalize tri norm";
          uStackY_210 = 0x65;
          goto LAB_001e3efb;
        }
        for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
          norm[lVar14] = *(double *)(edge_nodes + lVar14 * 2) *
                         (double)CONCAT44(angle._4_4_,angle._0_4_) + norm[lVar14];
        }
        dVar23 = local_1c0 + (double)CONCAT44(angle._4_4_,angle._0_4_);
      }
      item = -1;
      pRVar6 = local_1d8->ref_adj->item;
      uVar18 = (ulong)pRVar6[(int)uVar18].next;
      if (uVar18 != 0xffffffffffffffff) {
        item = pRVar6[uVar18].ref;
      }
    }
    auVar20._0_8_ = dVar23 * 1e+20;
    auVar20._8_8_ = norm[0];
    auVar21._8_8_ = -norm[0];
    auVar21._0_8_ = -auVar20._0_8_;
    auVar21 = maxpd(auVar20,auVar21);
    dVar19 = auVar21._0_8_;
    if (dVar19 <= auVar21._8_8_) {
LAB_001e3f08:
      pcVar15 = "normal";
      uVar12 = 0x96;
      goto LAB_001e3b34;
    }
    RVar22 = norm[1];
    if (norm[1] <= -norm[1]) {
      RVar22 = -norm[1];
    }
    if (dVar19 <= RVar22) goto LAB_001e3f08;
    RVar22 = norm[2];
    if (norm[2] <= -norm[2]) {
      RVar22 = -norm[2];
    }
    if (dVar19 <= RVar22) goto LAB_001e3f08;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      norm[lVar14] = norm[lVar14] / dVar23;
    }
    uVar9 = ref_math_normalize(norm);
    if (uVar9 != 0) {
      pcVar15 = "normalize average norm";
      uStackY_210 = 0x71;
LAB_001e3efb:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
             uStackY_210,"ref_layer_normal",(ulong)uVar9,pcVar15);
      uVar8 = uVar9;
      goto LAB_001e3f08;
    }
    pRVar3 = ref_node->real;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      pRVar3[node * 0xf + lVar14] = norm[lVar14] * 0.1 + pRVar3[local_200 * 0xf + lVar14];
    }
  }
  lVar14 = 0;
  do {
    pRVar7 = local_1e0;
    pRVar10 = local_1e0->ref_list;
    uVar18 = (ulong)pRVar10->n;
    if ((long)uVar18 <= lVar14) {
      local_1d8 = (REF_CELL)0x0;
      while( true ) {
        if ((long)(int)uVar18 <= (long)local_1d8) {
          return 0;
        }
        RVar16 = pRVar10->value[(long)local_1d8];
        uVar9 = ref_cell_nodes(local_1f8,RVar16,nodes);
        if (uVar9 != 0) break;
        local_1c0 = (double)CONCAT44(local_1c0._4_4_,RVar16);
        local_1c8 = (ulong)RVar16;
        pRVar13 = (REF_CELL)0x0;
        while ((long)pRVar13 < (long)local_1f8->edge_per) {
          RVar16 = nodes[local_1f8->e2n[(long)pRVar13 * 2]];
          iVar1 = nodes[local_1f8->e2n[(long)pRVar13 * 2 + 1]];
          local_1b8 = pRVar13;
          uVar8 = ref_cell_list_with2(local_1f8,RVar16,iVar1,2,&ncell,(REF_INT *)&angle);
          if (uVar8 != 0) {
            pcVar15 = "find with 2";
            uVar12 = 0xb5;
            goto LAB_001e435c;
          }
          lVar14 = (long)ncell;
          if (lVar14 != 2) {
            pcVar15 = "expected two tri for tri side";
            uVar18 = 2;
            uVar12 = 0xb6;
            goto LAB_001e4464;
          }
          uVar8 = ref_list_contains(pRVar7->ref_list,angle._0_4_,&contains0);
          if (uVar8 != 0) {
            pcVar15 = "0 in layer";
            uVar12 = 0xb9;
LAB_001e435c:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,uVar12,"ref_layer_puff",(ulong)uVar8,pcVar15);
            return uVar8;
          }
          uVar8 = ref_list_contains(pRVar7->ref_list,angle._4_4_,&contains1);
          if (uVar8 != 0) {
            pcVar15 = "1 in layer";
            uVar12 = 0xbc;
            goto LAB_001e435c;
          }
          if (contains0 == 0 || contains1 == 0) {
            if (contains0 == 0 && contains1 == 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0xbe,"ref_layer_puff","tri side is not in layer");
              return 1;
            }
            uVar9 = ref_node_local(ref_node,(long)RVar16,&local_200);
            RVar16 = local_1e8;
            if (uVar9 != 0) {
              pcVar15 = "local";
              uVar12 = 0xbf;
              goto LAB_001e4028;
            }
            edge_nodes[0] = local_200 + local_1e8;
            uVar9 = ref_node_local(ref_node,(long)iVar1,&local_200);
            if (uVar9 != 0) {
              pcVar15 = "local";
              uVar12 = 0xc1;
              goto LAB_001e4028;
            }
            edge_nodes[1] = local_200 + RVar16;
            if (contains0 != 0) {
              if (local_1c0._0_4_ == angle._0_4_) {
                edge_nodes[2] = local_1f8->c2n[(long)angle._4_4_ * (long)local_1f8->size_per + 3];
                goto LAB_001e4216;
              }
              uVar12 = 0xc4;
              angle._4_4_ = angle._0_4_;
LAB_001e445f:
              lVar14 = (long)angle._4_4_;
              pcVar15 = "cell should be in layer";
              uVar18 = local_1c8;
LAB_001e4464:
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,uVar12,"ref_layer_puff",pcVar15,uVar18,lVar14);
              return 1;
            }
LAB_001e4216:
            if (contains1 != 0) {
              if (local_1c0._0_4_ != angle._4_4_) {
                uVar12 = 200;
                goto LAB_001e445f;
              }
              edge_nodes[2] = local_1f8->c2n[(long)angle._0_4_ * (long)local_1f8->size_per + 3];
            }
            uVar9 = ref_cell_add(ref_cell,edge_nodes,&new_cell);
            if (uVar9 != 0) {
              pcVar15 = "add";
              uVar12 = 0xcb;
              goto LAB_001e4028;
            }
          }
          pRVar13 = (REF_CELL)((long)&local_1b8->type + 1);
        }
        local_1d8 = (REF_CELL)((long)&local_1d8->type + 1);
        pRVar10 = local_1e0->ref_list;
        uVar18 = (ulong)(uint)pRVar10->n;
      }
      pcVar15 = "nodes";
      uVar12 = 0xab;
LAB_001e4028:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
             uVar12,"ref_layer_puff",(ulong)uVar9,pcVar15);
      return uVar9;
    }
    uVar8 = ref_cell_nodes(local_1f8,pRVar10->value[lVar14],nodes);
    if (uVar8 != 0) {
      pcVar15 = "nodes";
      uVar12 = 0x9f;
      goto LAB_001e3b34;
    }
    for (lVar17 = 0; lVar17 < local_1f8->node_per; lVar17 = lVar17 + 1) {
      uVar8 = ref_node_local(ref_node,(long)nodes[lVar17],&local_200);
      if (uVar8 != 0) {
        pcVar15 = "local";
        uVar12 = 0xa1;
        goto LAB_001e3b34;
      }
      prism[lVar17] = local_200;
      prism[lVar17 + 3] = local_200 + local_1e8;
    }
    uVar8 = ref_cell_add(local_1b8,prism,&new_cell);
    lVar14 = lVar14 + 1;
    if (uVar8 != 0) {
      pcVar15 = "add";
      uVar12 = 0xa5;
LAB_001e3b34:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
             uVar12,"ref_layer_puff",(ulong)uVar8,pcVar15);
      return uVar8;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_layer_puff(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_CELL layer_prism = ref_grid_pri(ref_layer_grid(ref_layer));
  REF_CELL layer_edge = ref_grid_edg(ref_layer_grid(ref_layer));
  REF_INT item, cell, cell_node, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT prism[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT node, local, i, nnode_per_layer;
  REF_GLOB global;
  REF_DBL norm[3];

  /* first layer of nodes */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_node_add(layer_node, nodes[cell_node], &node), "add");
      for (i = 0; i < 3; i++)
        ref_node_xyz(layer_node, i, node) =
            ref_node_xyz(ref_grid_node(ref_grid), i, nodes[cell_node]);
    }
  }
  nnode_per_layer = ref_node_n(layer_node);
  ref_layer->nnode_per_layer = nnode_per_layer;

  /* second layer of nodes */
  for (local = 0; local < nnode_per_layer; local++) {
    global = (REF_GLOB)local + ref_node_n_global(ref_grid_node(ref_grid));
    RSS(ref_node_add(layer_node, global, &node), "add");
    RSS(ref_layer_normal(ref_layer, ref_grid,
                         (REF_INT)ref_node_global(layer_node, local), norm),
        "normal");
    for (i = 0; i < 3; i++)
      ref_node_xyz(layer_node, i, node) =
          0.1 * norm[i] + ref_node_xyz(layer_node, i, local);
  }

  /* layer of prisms */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_node_local(layer_node, nodes[cell_node], &local), "local");
      prism[cell_node] = local;
      prism[3 + cell_node] = local + nnode_per_layer;
    }
    RSS(ref_cell_add(layer_prism, prism, &new_cell), "add");
  }

  /* constrain faces */
  each_ref_list_item(ref_layer_list(ref_layer), item) {
    cell = ref_list_value(ref_layer_list(ref_layer), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      REF_INT node0;
      REF_INT node1;
      REF_INT ncell, cell_list[2];
      REF_BOOL contains0, contains1;
      REF_INT edge_nodes[REF_CELL_MAX_SIZE_PER];
      node0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      node1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_list),
          "find with 2");
      REIS(2, ncell, "expected two tri for tri side");
      RSS(ref_list_contains(ref_layer_list(ref_layer), cell_list[0],
                            &contains0),
          "0 in layer");
      RSS(ref_list_contains(ref_layer_list(ref_layer), cell_list[1],
                            &contains1),
          "1 in layer");
      if (contains0 && contains1) continue; /* tri side interior to layer */
      if (!contains0 && !contains1) THROW("tri side is not in layer");
      RSS(ref_node_local(layer_node, node0, &local), "local");
      edge_nodes[0] = local + nnode_per_layer;
      RSS(ref_node_local(layer_node, node1, &local), "local");
      edge_nodes[1] = local + nnode_per_layer;
      if (contains0) {
        REIS(cell, cell_list[0], "cell should be in layer");
        edge_nodes[2] = ref_cell_c2n(ref_cell, 3, cell_list[1]);
      }
      if (contains1) {
        REIS(cell, cell_list[1], "cell should be in layer");
        edge_nodes[2] = ref_cell_c2n(ref_cell, 3, cell_list[0]);
      }
      RSS(ref_cell_add(layer_edge, edge_nodes, &new_cell), "add");
    }
  }

  return REF_SUCCESS;
}